

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O1

Configurator * __thiscall Clasp::ClaspConfig::Impl::ConfiguratorProxy::ptr(ConfiguratorProxy *this)

{
  if (ptr()::ptrMask == '\0') {
    ptr();
  }
  return (Configurator *)(ptr::ptrMask & this->cfg);
}

Assistant:

Configurator* ptr() const {
			static const uint64 ptrMask = ~(bit_mask<uint64>(OnceBit) | bit_mask<uint64>(AcquireBit));
			return reinterpret_cast<Configurator*>(static_cast<uintp>(cfg & ptrMask));
		}